

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldInfo
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  undefined *puVar1;
  Descriptor *pDVar2;
  Printer *options_00;
  bool bVar3;
  int iVar4;
  OneofDescriptor *pOVar5;
  Descriptor *desc_00;
  int local_10c;
  undefined1 local_108 [4];
  int i;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  allocator local_69;
  string local_68;
  string local_48;
  GeneratorOptions *local_28;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = (GeneratorOptions *)desc;
  desc_local = (Descriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  bVar3 = anon_unknown_0::HasRepeatedFields(options,desc);
  pDVar2 = desc_local;
  if (bVar3) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)printer_local,local_28,desc);
    puVar1 = (anonymous_namespace)::kRepeatedFieldArrayName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,puVar1,&local_69);
    (anonymous_namespace)::RepeatedFieldNumberList_abi_cxx11_
              (&local_a0,(_anonymous_namespace_ *)printer_local,local_28,desc);
    desc = (Descriptor *)&local_48;
    io::Printer::Print((Printer *)pDVar2,
                       "/**\n * List of repeated fields within this message type.\n * @private {!Array<number>}\n * @const\n */\n$classname$$rptfieldarray$ = $rptfields$;\n\n"
                       ,"classname",(string *)desc,"rptfieldarray",&local_68,"rptfields",&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string((string *)&local_48);
  }
  bVar3 = anon_unknown_0::HasOneofFields((Descriptor *)local_28);
  pDVar2 = desc_local;
  if (bVar3) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_c0,(_anonymous_namespace_ *)printer_local,local_28,desc);
    puVar1 = (anonymous_namespace)::kOneofGroupArrayName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,puVar1,&local_e1);
    (anonymous_namespace)::OneofGroupList_abi_cxx11_
              ((string *)local_108,(_anonymous_namespace_ *)local_28,desc_00);
    io::Printer::Print((Printer *)pDVar2,
                       "/**\n * Oneof group definitions for this message. Each group defines the field\n * numbers belonging to that group. When of these fields\' value is set, all\n * other fields in the group are cleared. During deserialization, if multiple\n * fields are encountered for a group, only the last value seen will be kept.\n * @private {!Array<!Array<number>>}\n * @const\n */\n$classname$$oneofgrouparray$ = $oneofgroups$;\n\n"
                       ,"classname",&local_c0,"oneofgrouparray",&local_e0,"oneofgroups",
                       (string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::__cxx11::string::~string((string *)&local_c0);
    for (local_10c = 0; iVar4 = Descriptor::oneof_decl_count((Descriptor *)local_28),
        local_10c < iVar4; local_10c = local_10c + 1) {
      pOVar5 = Descriptor::oneof_decl((Descriptor *)local_28,local_10c);
      bVar3 = anon_unknown_0::IgnoreOneof(pOVar5);
      options_00 = printer_local;
      pDVar2 = desc_local;
      if (!bVar3) {
        pOVar5 = Descriptor::oneof_decl((Descriptor *)local_28,local_10c);
        GenerateOneofCaseDefinition(this,(GeneratorOptions *)options_00,(Printer *)pDVar2,pOVar5);
      }
    }
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldInfo(const GeneratorOptions& options,
                                       io::Printer* printer,
                                       const Descriptor* desc) const {
  if (HasRepeatedFields(options, desc)) {
    printer->Print(
        "/**\n"
        " * List of repeated fields within this message type.\n"
        " * @private {!Array<number>}\n"
        " * @const\n"
        " */\n"
        "$classname$$rptfieldarray$ = $rptfields$;\n"
        "\n",
        "classname", GetMessagePath(options, desc),
        "rptfieldarray", kRepeatedFieldArrayName,
        "rptfields", RepeatedFieldNumberList(options, desc));
  }

  if (HasOneofFields(desc)) {
    printer->Print(
        "/**\n"
        " * Oneof group definitions for this message. Each group defines the "
        "field\n"
        " * numbers belonging to that group. When of these fields' value is "
        "set, all\n"
        " * other fields in the group are cleared. During deserialization, if "
        "multiple\n"
        " * fields are encountered for a group, only the last value seen will "
        "be kept.\n"
        " * @private {!Array<!Array<number>>}\n"
        " * @const\n"
        " */\n"
        "$classname$$oneofgrouparray$ = $oneofgroups$;\n"
        "\n",
        "classname", GetMessagePath(options, desc),
        "oneofgrouparray", kOneofGroupArrayName,
        "oneofgroups", OneofGroupList(desc));

    for (int i = 0; i < desc->oneof_decl_count(); i++) {
      if (IgnoreOneof(desc->oneof_decl(i))) {
        continue;
      }
      GenerateOneofCaseDefinition(options, printer, desc->oneof_decl(i));
    }
  }
}